

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O0

void dr_prediction_z1_64xN_sse4_1
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  undefined1 (*pauVar1) [16];
  undefined1 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined6 uVar6;
  undefined4 uVar7;
  undefined6 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  undefined1 (*pauVar14) [16];
  long in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  undefined1 in_SIL;
  undefined7 in_register_00000031;
  int in_EDI;
  int in_R9D;
  ushort uVar15;
  ushort uVar16;
  short sVar20;
  ushort uVar21;
  short sVar22;
  ushort uVar23;
  ulong uVar17;
  ushort uVar24;
  short sVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  short sVar30;
  ushort uVar31;
  short sVar32;
  ushort uVar33;
  ulong uVar29;
  ushort uVar34;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  short sVar35;
  ushort uVar36;
  __m128i res;
  __m128i b;
  int r;
  int x;
  __m128i mask;
  __m128i base_inc;
  __m128i max_base;
  __m128i c3f;
  __m128i diff;
  __m128i a_mbase_x;
  __m128i a16;
  __m128i a32;
  __m128i a1;
  __m128i a0;
  int max_base_x;
  int frac_bits;
  int local_5dc;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  int local_590;
  char cStack_576;
  byte bStack_575;
  char cStack_574;
  byte bStack_573;
  char cStack_572;
  byte bStack_571;
  char cStack_56e;
  byte bStack_56d;
  char cStack_56c;
  byte bStack_56b;
  char cStack_56a;
  byte bStack_569;
  int local_550;
  int local_54c;
  undefined1 local_4a8;
  undefined8 *local_488;
  ushort uStack_436;
  ushort uStack_434;
  ushort uStack_432;
  ushort uStack_42e;
  ushort uStack_42c;
  ushort uStack_42a;
  ushort local_418;
  ushort uStack_416;
  ushort uStack_414;
  ushort uStack_412;
  ushort uStack_410;
  ushort uStack_40e;
  ushort uStack_40c;
  ushort uStack_40a;
  undefined8 local_3a8;
  undefined8 local_398;
  short local_368;
  short sStack_366;
  short sStack_364;
  short sStack_362;
  short sStack_360;
  short sStack_35e;
  short sStack_35c;
  short sStack_35a;
  short local_358;
  short sStack_356;
  short sStack_354;
  short sStack_352;
  short sStack_350;
  short sStack_34e;
  short sStack_34c;
  short sStack_34a;
  short local_348;
  short sStack_346;
  short sStack_344;
  short sStack_342;
  short sStack_340;
  short sStack_33e;
  short sStack_33c;
  short sStack_33a;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  ushort uStack_256;
  ushort uStack_254;
  ushort uStack_252;
  ushort uStack_24e;
  ushort uStack_24c;
  ushort uStack_24a;
  undefined1 local_1a8 [8];
  undefined1 local_1a0 [24];
  undefined1 local_188 [8];
  undefined1 local_180 [232];
  undefined1 local_98 [8];
  undefined1 local_90 [24];
  char local_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  char cStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  int mdif;
  int j;
  __m128i res_val;
  __m128i a1_above;
  __m128i a0_above;
  __m128i shift;
  int i;
  int base;
  __m128i res1;
  
  local_488 = (undefined8 *)CONCAT71(in_register_00000031,in_SIL);
  iVar12 = in_EDI + 0x3f;
  uVar2 = *(undefined1 *)(in_RCX + iVar12);
  local_1a0._0_3_ = CONCAT21(CONCAT11(uVar2,uVar2),uVar2);
  local_1a8._0_3_ = CONCAT21(CONCAT11(uVar2,uVar2),uVar2);
  uVar3 = CONCAT17(uVar2,CONCAT16(uVar2,CONCAT15(uVar2,CONCAT14(uVar2,CONCAT13(uVar2,local_1a8._0_3_
                                                                              )))));
  uVar4 = CONCAT17(uVar2,CONCAT16(uVar2,CONCAT15(uVar2,CONCAT14(uVar2,CONCAT13(uVar2,local_1a0._0_3_
                                                                              )))));
  local_4a8 = (undefined1)iVar12;
  local_180[2] = local_4a8;
  local_180[1] = local_4a8;
  local_180[0] = local_4a8;
  local_188[2] = local_4a8;
  local_188[1] = local_4a8;
  local_188[0] = local_4a8;
  auVar11[3] = local_4a8;
  auVar11._0_3_ = local_188._0_3_;
  auVar11[4] = local_4a8;
  auVar11[5] = local_4a8;
  auVar11[6] = local_4a8;
  auVar11[7] = local_4a8;
  auVar11[0xb] = local_4a8;
  auVar11._8_3_ = local_180._0_3_;
  auVar11[0xc] = local_4a8;
  auVar11[0xd] = local_4a8;
  auVar11[0xe] = local_4a8;
  auVar11[0xf] = local_4a8;
  local_550 = 0;
  local_54c = in_R9D;
  while( true ) {
    if (in_EDI <= local_550) {
      return;
    }
    iVar13 = local_54c >> 6;
    if (iVar12 <= iVar13) break;
    uVar17 = CONCAT26((undefined2)local_54c,
                      CONCAT24((undefined2)local_54c,
                               CONCAT22((undefined2)local_54c,(undefined2)local_54c))) &
             0x3f003f003f003f;
    uVar29 = CONCAT26((undefined2)local_54c,
                      CONCAT24((undefined2)local_54c,
                               CONCAT22((undefined2)local_54c,(undefined2)local_54c))) &
             0x3f003f003f003f;
    local_418 = (ushort)uVar17;
    uStack_416 = (ushort)(uVar17 >> 0x10);
    uStack_414 = (ushort)(uVar17 >> 0x20);
    uStack_410 = (ushort)uVar29;
    uStack_40e = (ushort)(uVar29 >> 0x10);
    uStack_40c = (ushort)(uVar29 >> 0x20);
    uVar24 = (ushort)(uVar17 >> 0x31);
    uVar34 = (ushort)(uVar29 >> 0x31);
    for (local_5dc = 0; local_5dc < 0x40; local_5dc = local_5dc + 0x10) {
      if (iVar12 - (iVar13 + local_5dc) < 1) {
        *(undefined8 *)((long)local_488 + (long)local_5dc) = uVar3;
        ((undefined8 *)((long)local_488 + (long)local_5dc))[1] = uVar4;
      }
      else {
        pauVar14 = (undefined1 (*) [16])(in_RCX + iVar13 + (long)local_5dc);
        pauVar1 = (undefined1 (*) [16])((long)local_5dc + 1 + in_RCX + iVar13);
        auVar18 = pmovzxbw(*pauVar14,*(undefined8 *)*pauVar14);
        auVar19 = pmovzxbw(*pauVar1,*(undefined8 *)*pauVar1);
        local_338 = auVar19._0_2_;
        sStack_336 = auVar19._2_2_;
        sStack_334 = auVar19._4_2_;
        sStack_332 = auVar19._6_2_;
        sStack_330 = auVar19._8_2_;
        sStack_32e = auVar19._10_2_;
        sStack_32c = auVar19._12_2_;
        sStack_32a = auVar19._14_2_;
        local_348 = auVar18._0_2_;
        sStack_346 = auVar18._2_2_;
        sStack_344 = auVar18._4_2_;
        sStack_342 = auVar18._6_2_;
        sStack_340 = auVar18._8_2_;
        sStack_33e = auVar18._10_2_;
        sStack_33c = auVar18._12_2_;
        sStack_33a = auVar18._14_2_;
        auVar18 = psllw(auVar18,ZEXT416(5));
        local_2b8 = auVar18._0_2_;
        sStack_2b6 = auVar18._2_2_;
        sStack_2b4 = auVar18._4_2_;
        sStack_2b2 = auVar18._6_2_;
        sStack_2b0 = auVar18._8_2_;
        sStack_2ae = auVar18._10_2_;
        sStack_2ac = auVar18._12_2_;
        sStack_2aa = auVar18._14_2_;
        uVar15 = local_2b8 + 0x10 + (local_338 - local_348) * (local_418 >> 1);
        sVar20 = sStack_2b6 + 0x10 + (sStack_336 - sStack_346) * (uStack_416 >> 1);
        sVar22 = sStack_2b4 + 0x10 + (sStack_334 - sStack_344) * (uStack_414 >> 1);
        sVar25 = sStack_2b2 + 0x10 + (sStack_332 - sStack_342) * uVar24;
        uVar27 = sStack_2b0 + 0x10 + (sStack_330 - sStack_340) * (uStack_410 >> 1);
        sVar30 = sStack_2ae + 0x10 + (sStack_32e - sStack_33e) * (uStack_40e >> 1);
        sVar32 = sStack_2ac + 0x10 + (sStack_32c - sStack_33c) * (uStack_40c >> 1);
        sVar35 = sStack_2aa + 0x10 + (sStack_32a - sStack_33a) * uVar34;
        cStack_576 = (char)sVar20;
        bStack_575 = (byte)((ushort)sVar20 >> 8);
        cStack_574 = (char)sVar22;
        bStack_573 = (byte)((ushort)sVar22 >> 8);
        cStack_572 = (char)sVar25;
        bStack_571 = (byte)((ushort)sVar25 >> 8);
        cStack_56e = (char)sVar30;
        bStack_56d = (byte)((ushort)sVar30 >> 8);
        cStack_56c = (char)sVar32;
        bStack_56b = (byte)((ushort)sVar32 >> 8);
        cStack_56a = (char)sVar35;
        bStack_569 = (byte)((ushort)sVar35 >> 8);
        uVar5 = CONCAT13(bStack_575,CONCAT12(cStack_576,uVar15));
        uVar6 = CONCAT15(bStack_573,CONCAT14(cStack_574,uVar5));
        uVar7 = CONCAT13(bStack_56d,CONCAT12(cStack_56e,uVar27));
        uVar8 = CONCAT15(bStack_56b,CONCAT14(cStack_56c,uVar7));
        uVar15 = uVar15 >> 5;
        uVar27 = uVar27 >> 5;
        cStack_576 = (char)(ushort)((uint)uVar5 >> 0x15);
        bStack_575 = bStack_575 >> 5;
        cStack_574 = (char)(ushort)((uint6)uVar6 >> 0x25);
        bStack_573 = bStack_573 >> 5;
        cStack_572 = (char)(ushort)(CONCAT17(bStack_571,CONCAT16(cStack_572,uVar6)) >> 0x35);
        bStack_571 = bStack_571 >> 5;
        cStack_56e = (char)(ushort)((uint)uVar7 >> 0x15);
        bStack_56d = bStack_56d >> 5;
        cStack_56c = (char)(ushort)((uint6)uVar8 >> 0x25);
        bStack_56b = bStack_56b >> 5;
        cStack_56a = (char)(ushort)(CONCAT17(bStack_569,CONCAT16(cStack_56a,uVar8)) >> 0x35);
        bStack_569 = bStack_569 >> 5;
        local_398 = SUB168(*pauVar14,8);
        auVar18 = pmovzxbw(*pauVar14 >> 0x40,local_398);
        local_3a8 = SUB168(*pauVar1,8);
        auVar19 = pmovzxbw(*pauVar1 >> 0x40,local_3a8);
        local_358 = auVar19._0_2_;
        sStack_356 = auVar19._2_2_;
        sStack_354 = auVar19._4_2_;
        sStack_352 = auVar19._6_2_;
        sStack_350 = auVar19._8_2_;
        sStack_34e = auVar19._10_2_;
        sStack_34c = auVar19._12_2_;
        sStack_34a = auVar19._14_2_;
        local_368 = auVar18._0_2_;
        sStack_366 = auVar18._2_2_;
        sStack_364 = auVar18._4_2_;
        sStack_362 = auVar18._6_2_;
        sStack_360 = auVar18._8_2_;
        sStack_35e = auVar18._10_2_;
        sStack_35c = auVar18._12_2_;
        sStack_35a = auVar18._14_2_;
        auVar18 = psllw(auVar18,ZEXT416(5));
        local_2f8 = auVar18._0_2_;
        sStack_2f6 = auVar18._2_2_;
        sStack_2f4 = auVar18._4_2_;
        sStack_2f2 = auVar18._6_2_;
        sStack_2f0 = auVar18._8_2_;
        sStack_2ee = auVar18._10_2_;
        sStack_2ec = auVar18._12_2_;
        sStack_2ea = auVar18._14_2_;
        uVar16 = (ushort)(local_2f8 + 0x10 + (local_358 - local_368) * (local_418 >> 1)) >> 5;
        uVar21 = (ushort)(sStack_2f6 + 0x10 + (sStack_356 - sStack_366) * (uStack_416 >> 1)) >> 5;
        uVar23 = (ushort)(sStack_2f4 + 0x10 + (sStack_354 - sStack_364) * (uStack_414 >> 1)) >> 5;
        uVar26 = (ushort)(sStack_2f2 + 0x10 + (sStack_352 - sStack_362) * uVar24) >> 5;
        uVar28 = (ushort)(sStack_2f0 + 0x10 + (sStack_350 - sStack_360) * (uStack_410 >> 1)) >> 5;
        uVar31 = (ushort)(sStack_2ee + 0x10 + (sStack_34e - sStack_35e) * (uStack_40e >> 1)) >> 5;
        uVar33 = (ushort)(sStack_2ec + 0x10 + (sStack_34c - sStack_35c) * (uStack_40c >> 1)) >> 5;
        uVar36 = (ushort)(sStack_2ea + 0x10 + (sStack_34a - sStack_35a) * uVar34) >> 5;
        uVar5 = CONCAT13(bStack_575,CONCAT12(cStack_576,uVar15));
        uVar6 = CONCAT15(bStack_573,CONCAT14(cStack_574,uVar5));
        uVar7 = CONCAT13(bStack_56d,CONCAT12(cStack_56e,uVar27));
        uVar8 = CONCAT15(bStack_56b,CONCAT14(cStack_56c,uVar7));
        uStack_256 = (ushort)((uint)uVar5 >> 0x10);
        uStack_254 = (ushort)((uint6)uVar6 >> 0x20);
        uStack_252 = (ushort)(CONCAT17(bStack_571,CONCAT16(cStack_572,uVar6)) >> 0x30);
        uStack_24e = (ushort)((uint)uVar7 >> 0x10);
        uStack_24c = (ushort)((uint6)uVar8 >> 0x20);
        uStack_24a = (ushort)(CONCAT17(bStack_569,CONCAT16(cStack_56a,uVar8)) >> 0x30);
        local_98[0] = (char)iVar13 + (char)local_5dc;
        local_90[2] = local_98[0] + '\n';
        local_90[1] = local_98[0] + '\t';
        local_90[0] = local_98[0] + '\b';
        local_98[2] = local_98[0] + '\x02';
        local_98[1] = local_98[0] + '\x01';
        auVar10[3] = local_98[0] + '\x03';
        auVar10._0_3_ = local_98._0_3_;
        auVar10[4] = local_98[0] + '\x04';
        auVar10[5] = local_98[0] + '\x05';
        auVar10[6] = local_98[0] + '\x06';
        auVar10[7] = local_98[0] + '\a';
        auVar10[0xb] = local_98[0] + '\v';
        auVar10._8_3_ = local_90._0_3_;
        auVar10[0xc] = local_98[0] + '\f';
        auVar10[0xd] = local_98[0] + '\r';
        auVar10[0xe] = local_98[0] + '\x0e';
        auVar10[0xf] = local_98[0] + '\x0f';
        auVar18 = psubusb(auVar11,auVar10);
        local_78 = auVar18[0];
        cStack_77 = auVar18[1];
        cStack_76 = auVar18[2];
        cStack_75 = auVar18[3];
        cStack_74 = auVar18[4];
        cStack_73 = auVar18[5];
        cStack_72 = auVar18[6];
        cStack_71 = auVar18[7];
        cStack_70 = auVar18[8];
        cStack_6f = auVar18[9];
        cStack_6e = auVar18[10];
        cStack_6d = auVar18[0xb];
        cStack_6c = auVar18[0xc];
        cStack_6b = auVar18[0xd];
        cStack_6a = auVar18[0xe];
        cStack_69 = auVar18[0xf];
        auVar19[1] = (uStack_256 != 0) * (uStack_256 < 0x100) * cStack_576 - (0xff < uStack_256);
        auVar19[0] = (uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 - (0xff < uVar15);
        auVar19[2] = (uStack_254 != 0) * (uStack_254 < 0x100) * cStack_574 - (0xff < uStack_254);
        auVar19[3] = (uStack_252 != 0) * (uStack_252 < 0x100) * cStack_572 - (0xff < uStack_252);
        auVar19[4] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
        auVar19[5] = (uStack_24e != 0) * (uStack_24e < 0x100) * cStack_56e - (0xff < uStack_24e);
        auVar19[6] = (uStack_24c != 0) * (uStack_24c < 0x100) * cStack_56c - (0xff < uStack_24c);
        auVar19[7] = (uStack_24a != 0) * (uStack_24a < 0x100) * cStack_56a - (0xff < uStack_24a);
        auVar19[9] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
        auVar19[8] = (uVar16 != 0) * (uVar16 < 0x100) * (char)uVar16 - (0xff < uVar16);
        auVar19[10] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
        auVar19[0xb] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
        auVar19[0xc] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
        auVar19[0xd] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
        auVar19[0xe] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
        auVar19[0xf] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
        auVar18[1] = -('\0' < cStack_77);
        auVar18[0] = -('\0' < local_78);
        auVar18[2] = -('\0' < cStack_76);
        auVar18[3] = -('\0' < cStack_75);
        auVar18[4] = -('\0' < cStack_74);
        auVar18[5] = -('\0' < cStack_73);
        auVar18[6] = -('\0' < cStack_72);
        auVar18[7] = -('\0' < cStack_71);
        auVar18[9] = -('\0' < cStack_6f);
        auVar18[8] = -('\0' < cStack_70);
        auVar18[10] = -('\0' < cStack_6e);
        auVar18[0xb] = -('\0' < cStack_6d);
        auVar18[0xc] = -('\0' < cStack_6c);
        auVar18[0xd] = -('\0' < cStack_6b);
        auVar18[0xe] = -('\0' < cStack_6a);
        auVar18[0xf] = -('\0' < cStack_69);
        auVar9._8_8_ = uVar4;
        auVar9._0_8_ = uVar3;
        auVar18 = pblendvb(auVar9,auVar19,auVar18);
        local_5d8 = auVar18._0_8_;
        uStack_5d0 = auVar18._8_8_;
        *(undefined8 *)((long)local_488 + (long)local_5dc) = local_5d8;
        ((undefined8 *)((long)local_488 + (long)local_5dc))[1] = uStack_5d0;
      }
    }
    local_54c = in_R9D + local_54c;
    local_550 = local_550 + 1;
    local_488 = (undefined8 *)(CONCAT71(in_register_00000011,in_DL) + (long)local_488);
  }
  for (local_590 = local_550; local_590 < in_EDI; local_590 = local_590 + 1) {
    *local_488 = uVar3;
    local_488[1] = uVar4;
    local_488[2] = uVar3;
    local_488[3] = uVar4;
    local_488[4] = uVar3;
    local_488[5] = uVar4;
    local_488[6] = uVar3;
    local_488[7] = uVar4;
    local_488 = (undefined8 *)(CONCAT71(in_register_00000011,in_DL) + (long)local_488);
  }
  return;
}

Assistant:

static void dr_prediction_z1_64xN_sse4_1(int N, uint8_t *dst, ptrdiff_t stride,
                                         const uint8_t *above,
                                         int upsample_above, int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((64 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m128i a0, a1, a32, a16;
  __m128i a_mbase_x, diff, c3f;
  __m128i max_base, base_inc, mask;

  a16 = _mm_set1_epi16(16);
  a_mbase_x = _mm_set1_epi8((char)above[max_base_x]);
  max_base = _mm_set1_epi8(max_base_x);
  c3f = _mm_set1_epi16(0x3f);

  int x = dx;
  for (int r = 0; r < N; r++, dst += stride) {
    __m128i b, res, res1;
    int base = x >> frac_bits;
    if (base >= max_base_x) {
      for (int i = r; i < N; ++i) {
        _mm_storeu_si128((__m128i *)dst, a_mbase_x);  // save 32 values
        _mm_storeu_si128((__m128i *)(dst + 16), a_mbase_x);
        _mm_storeu_si128((__m128i *)(dst + 32), a_mbase_x);
        _mm_storeu_si128((__m128i *)(dst + 48), a_mbase_x);
        dst += stride;
      }
      return;
    }

    __m128i shift =
        _mm_srli_epi16(_mm_and_si128(_mm_set1_epi16(x), c3f), 1);  // 8 element

    __m128i a0_above, a1_above, res_val;
    for (int j = 0; j < 64; j += 16) {
      int mdif = max_base_x - (base + j);
      if (mdif <= 0) {
        _mm_storeu_si128((__m128i *)(dst + j), a_mbase_x);
      } else {
        a0_above =
            _mm_loadu_si128((__m128i *)(above + base + j));  // load 16 element
        a1_above = _mm_loadu_si128((__m128i *)(above + base + 1 + j));

        // lower half
        a0 = _mm_cvtepu8_epi16(a0_above);
        a1 = _mm_cvtepu8_epi16(a1_above);

        diff = _mm_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm_add_epi16(a32, a16);  // a[x] * 32 + 16
        b = _mm_mullo_epi16(diff, shift);

        res = _mm_add_epi16(a32, b);
        res = _mm_srli_epi16(res, 5);

        // uppar half
        a0 = _mm_cvtepu8_epi16(_mm_srli_si128(a0_above, 8));
        a1 = _mm_cvtepu8_epi16(_mm_srli_si128(a1_above, 8));

        diff = _mm_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm_add_epi16(a32, a16);  // a[x] * 32 + 16

        b = _mm_mullo_epi16(diff, shift);
        res1 = _mm_add_epi16(a32, b);
        res1 = _mm_srli_epi16(res1, 5);

        res = _mm_packus_epi16(res, res1);  // 16 8bit values

        base_inc =
            _mm_setr_epi8((int8_t)(base + j), (int8_t)(base + j + 1),
                          (int8_t)(base + j + 2), (int8_t)(base + j + 3),
                          (int8_t)(base + j + 4), (int8_t)(base + j + 5),
                          (int8_t)(base + j + 6), (int8_t)(base + j + 7),
                          (int8_t)(base + j + 8), (int8_t)(base + j + 9),
                          (int8_t)(base + j + 10), (int8_t)(base + j + 11),
                          (int8_t)(base + j + 12), (int8_t)(base + j + 13),
                          (int8_t)(base + j + 14), (int8_t)(base + j + 15));

        mask = _mm_cmpgt_epi8(_mm_subs_epu8(max_base, base_inc),
                              _mm_setzero_si128());
        res_val = _mm_blendv_epi8(a_mbase_x, res, mask);
        _mm_storeu_si128((__m128i *)(dst + j), res_val);
      }
    }
    x += dx;
  }
}